

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmci.c
# Opt level: O3

void Bmc_BmciUnfold(Gia_Man_t *pNew,Gia_Man_t *p,Vec_Int_t *vFFLits,int fPiReuse)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Gia_Obj_t *pGVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  bool bVar16;
  
  uVar5 = p->nRegs;
  uVar9 = (ulong)uVar5;
  if (uVar5 != vFFLits->nSize) {
    __assert_fail("Gia_ManRegNum(p) == Vec_IntSize(vFFLits)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmci.c"
                  ,0x5f,"void Bmc_BmciUnfold(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)");
  }
  pGVar1 = p->pObjs;
  pGVar1->Value = 0;
  pVVar4 = p->vCis;
  iVar3 = pVVar4->nSize;
  uVar14 = iVar3 - uVar5;
  if (0 < (int)uVar5) {
    uVar10 = (ulong)uVar14;
    lVar12 = 0;
    uVar13 = uVar9;
    do {
      if (((int)uVar10 < 0) || (iVar3 <= (int)uVar10)) goto LAB_005711a4;
      iVar7 = pVVar4->pArray[uVar10];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_00571185;
      bVar16 = uVar13 == 0;
      uVar13 = uVar13 - 1;
      if (bVar16) goto LAB_005711a4;
      pGVar1[iVar7].Value = *(uint *)((long)vFFLits->pArray + lVar12);
      uVar10 = uVar10 + 1;
      lVar12 = lVar12 + 4;
    } while (uVar13 != 0);
  }
  if (0 < (int)uVar14) {
    lVar12 = 0;
    do {
      if (iVar3 <= lVar12) goto LAB_005711a4;
      iVar3 = pVVar4->pArray[lVar12];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_00571185;
      pGVar1 = p->pObjs;
      if (pGVar1 == (Gia_Obj_t *)0x0) break;
      if (fPiReuse == 0) {
        pGVar8 = Gia_ManAppendObj(pNew);
        uVar9 = *(ulong *)pGVar8;
        *(ulong *)pGVar8 = uVar9 | 0x9fffffff;
        *(ulong *)pGVar8 =
             uVar9 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(pNew->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar2 = pNew->pObjs;
        if ((pGVar8 < pGVar2) || (pGVar2 + pNew->nObjs <= pGVar8)) {
LAB_005711c3:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(pNew->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar2) >> 2) * -0x55555555);
        pGVar2 = pNew->pObjs;
        if ((pGVar8 < pGVar2) || (pGVar2 + pNew->nObjs <= pGVar8)) goto LAB_005711c3;
        uVar5 = (int)((ulong)((long)pGVar8 - (long)pGVar2) >> 2) * 0x55555556;
        uVar9 = (ulong)(uint)p->nRegs;
        pVVar4 = p->vCis;
      }
      else {
        iVar7 = pNew->vCis->nSize;
        iVar11 = iVar7 - pNew->nRegs;
        uVar13 = (ulong)(iVar11 - uVar14) + lVar12;
        iVar6 = (int)uVar13;
        if (iVar11 <= iVar6) {
          __assert_fail("v < Gia_ManPiNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
        }
        if ((iVar6 < 0) || (iVar7 <= iVar6)) goto LAB_005711a4;
        iVar7 = pNew->vCis->pArray[uVar13 & 0xffffffff];
        if (((long)iVar7 < 0) || (pNew->nObjs <= iVar7)) goto LAB_00571185;
        pGVar2 = pNew->pObjs;
        pGVar8 = (Gia_Obj_t *)((ulong)(pGVar2 + iVar7) & 0xfffffffffffffffe);
        if ((pGVar8 < pGVar2) || (pGVar2 + (uint)pNew->nObjs <= pGVar8)) goto LAB_005711c3;
        iVar6 = (int)((ulong)((long)pGVar8 - (long)pGVar2) >> 2);
        if (iVar6 * -0x55555555 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        uVar5 = ((uint)(pGVar2 + iVar7) & 1) + iVar6 * 0x55555556;
      }
      pGVar1[iVar3].Value = uVar5;
      lVar12 = lVar12 + 1;
      iVar3 = pVVar4->nSize;
      uVar14 = iVar3 - (int)uVar9;
    } while (lVar12 < (int)uVar14);
  }
  iVar3 = p->nObjs;
  if (0 < iVar3) {
    lVar12 = 8;
    lVar15 = 0;
    do {
      pGVar1 = p->pObjs;
      if (pGVar1 == (Gia_Obj_t *)0x0) break;
      uVar9 = *(ulong *)((long)pGVar1 + lVar12 + -8);
      if ((uVar9 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar9) {
        uVar5 = *(uint *)((long)pGVar1 + lVar12 + (ulong)(uint)((int)(uVar9 & 0x1fffffff) << 2) * -3
                         );
        if (((int)uVar5 < 0) ||
           (uVar14 = *(uint *)((long)pGVar1 +
                              lVar12 + (ulong)((uint)(uVar9 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar14 < 0)) goto LAB_005711e2;
        iVar3 = Gia_ManHashAnd(pNew,uVar5 ^ (uint)(uVar9 >> 0x1d) & 1,
                               uVar14 ^ (uint)(uVar9 >> 0x3d) & 1);
        *(int *)(&pGVar1->field_0x0 + lVar12) = iVar3;
        iVar3 = p->nObjs;
      }
      lVar15 = lVar15 + 1;
      lVar12 = lVar12 + 0xc;
    } while (lVar15 < iVar3);
    uVar9 = (ulong)(uint)p->nRegs;
  }
  if (0 < (int)uVar9) {
    pVVar4 = p->vCos;
    lVar12 = 0;
    do {
      iVar3 = pVVar4->nSize;
      uVar9 = (ulong)(uint)(iVar3 - (int)uVar9) + lVar12;
      iVar7 = (int)uVar9;
      if ((iVar7 < 0) || (iVar3 <= iVar7)) {
LAB_005711a4:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar3 = pVVar4->pArray[uVar9 & 0xffffffff];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) {
LAB_00571185:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      pGVar1 = p->pObjs + iVar3;
      uVar14 = (uint)*(undefined8 *)pGVar1;
      uVar5 = pGVar1[-(ulong)(uVar14 & 0x1fffffff)].Value;
      if ((int)uVar5 < 0) {
LAB_005711e2:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      if (vFFLits->nSize <= lVar12) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      vFFLits->pArray[lVar12] = uVar14 >> 0x1d & 1 ^ uVar5;
      lVar12 = lVar12 + 1;
      uVar9 = (ulong)p->nRegs;
    } while (lVar12 < (long)uVar9);
  }
  return;
}

Assistant:

void Bmc_BmciUnfold( Gia_Man_t * pNew, Gia_Man_t * p, Vec_Int_t * vFFLits, int fPiReuse )
{
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManRegNum(p) == Vec_IntSize(vFFLits) );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachRo( p, pObj, i )
        pObj->Value = Vec_IntEntry(vFFLits, i);
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = fPiReuse ? Gia_ObjToLit(pNew, Gia_ManPi(pNew, Gia_ManPiNum(pNew)-Gia_ManPiNum(p)+i)) : Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachRi( p, pObj, i )
        Vec_IntWriteEntry( vFFLits, i, Gia_ObjFanin0Copy(pObj) );
}